

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O2

void xe::writeTestLog(BatchResult *result,ostream *stream)

{
  char cVar1;
  TestStatusCode code;
  long lVar2;
  int iVar3;
  _Alloc_hider _Var4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  ConstTestCaseResultPtr caseData;
  _Alloc_hider local_50;
  
  if ((result->m_sessionInfo).releaseName._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo releaseName ");
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(string *)result);
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).releaseId._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo releaseId ");
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,(string *)&(result->m_sessionInfo).releaseId);
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).targetName._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo targetName ");
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,(string *)&(result->m_sessionInfo).targetName);
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).candyTargetName._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo candyTargetName ");
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,(string *)&(result->m_sessionInfo).candyTargetName
              );
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).configName._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo configName ");
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,(string *)&(result->m_sessionInfo).configName);
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).resultName._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo resultName ");
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,(string *)&(result->m_sessionInfo).resultName);
    operator<<(poVar5,(ContainerValue *)&stack0xffffffffffffffb0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  if ((result->m_sessionInfo).timestamp._M_string_length != 0) {
    poVar5 = std::operator<<(stream,"#sessionInfo timestamp ");
    poVar5 = std::operator<<(poVar5,(string *)&(result->m_sessionInfo).timestamp);
    std::operator<<(poVar5,"\n");
  }
  std::operator<<(stream,"#beginSession\n");
  for (iVar8 = 0;
      iVar8 < (int)((ulong)((long)(result->m_testCaseResults).
                                  super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->m_testCaseResults).
                                 super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4); iVar8 = iVar8 + 1
      ) {
    BatchResult::getTestCaseResult((BatchResult *)&stack0xffffffffffffffb0,(int)result);
    _Var4._M_p = local_50._M_p;
    poVar5 = std::operator<<(stream,"\n#beginTestCaseResult ");
    poVar5 = std::operator<<(poVar5,*(char **)_Var4._M_p);
    std::operator<<(poVar5,"\n");
    lVar2 = *(long *)(_Var4._M_p + 0x48);
    iVar3 = (int)*(long *)(_Var4._M_p + 0x50);
    if (iVar3 != (int)lVar2 && -1 < iVar3 - (int)lVar2) {
      lVar6 = 0;
      if (lVar2 != *(long *)(_Var4._M_p + 0x50)) {
        lVar6 = lVar2;
      }
      std::ostream::write((char *)stream,lVar6);
      lVar2 = *(long *)(_Var4._M_p + 0x48);
      lVar6 = 0;
      if (lVar2 != *(long *)(_Var4._M_p + 0x50)) {
        lVar6 = lVar2;
      }
      cVar1 = *(char *)(lVar6 + (int)((int)*(long *)(_Var4._M_p + 0x50) + ~(uint)lVar2));
      if ((cVar1 != '\n') && (cVar1 != '\r')) {
        std::operator<<(stream,"\n");
      }
    }
    code = *(TestStatusCode *)(_Var4._M_p + 0x20);
    pcVar7 = "#endTestCaseResult\n";
    poVar5 = stream;
    if ((code < TESTSTATUSCODE_LAST) &&
       (pcVar7 = "#endTestCaseResult\n", (0x2c00U >> (code & 0x1f) & 1) != 0)) {
      poVar5 = std::operator<<(stream,"#terminateTestCaseResult ");
      pcVar7 = getTestStatusCodeName(code);
      poVar5 = std::operator<<(poVar5,pcVar7);
      pcVar7 = "\n";
    }
    std::operator<<(poVar5,pcVar7);
    de::SharedPtr<const_xe::TestCaseResultData>::~SharedPtr
              ((SharedPtr<const_xe::TestCaseResultData> *)&stack0xffffffffffffffb0);
  }
  std::operator<<(stream,"\n#endSession\n");
  return;
}

Assistant:

void writeTestLog (const BatchResult& result, std::ostream& stream)
{
	writeSessionInfo(result.getSessionInfo(), stream);

	stream << "#beginSession\n";

	for (int ndx = 0; ndx < result.getNumTestCaseResults(); ndx++)
	{
		ConstTestCaseResultPtr caseData = result.getTestCaseResult(ndx);
		writeTestCase(*caseData, stream);
	}

	stream << "\n#endSession\n";
}